

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_extb_32(m68k_info *info)

{
  long in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  m68k_info *in_stack_00000010;
  
  if ((*(uint *)(in_RDI + 0x28) & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x386dad);
  }
  else {
    build_d(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
  }
  return;
}

Assistant:

static void d68020_extb_32(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68020_PLUS);
	build_d(info, M68K_INS_EXTB, 4);
}